

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::equals_msg(void)

{
  allocator local_c9;
  string msg;
  string expected;
  Assert local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [3];
  
  local_88.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_88.m_line = 0x53;
  std::__cxx11::string::string((string *)&msg,"Message",&local_c9);
  s_abi_cxx11_(&expected,"Hello",5);
  s_abi_cxx11_(local_78,"World",5);
  UnitTests::Assert::Equals<std::__cxx11::string,std::__cxx11::string>
            (&local_88,&msg,&expected,local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::string::~string((string *)&msg);
  expected._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  expected._M_string_length._0_4_ = 0x54;
  std::__cxx11::string::string
            ((string *)&msg,"ASSERT_EQUALS should have fired here.",(allocator *)local_78);
  UnitTests::Assert::Fail((Assert *)&expected,&msg);
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }